

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh.cpp
# Opt level: O1

void __thiscall
polyscope::VolumeMesh::VolumeMesh
          (VolumeMesh *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vertexPositions_,
          vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>
          *cellIndices_)

{
  ManagedBufferRegistry *registry_;
  undefined1 *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined8 uVar3;
  pointer pcVar4;
  double dVar5;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar6;
  long *plVar7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  size_type *psVar10;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [16];
  vec3 vVar15;
  vec3 hsv;
  string local_1c0;
  string local_1a0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_180;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_178;
  vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_> *local_170;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_168;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_160;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_158;
  vector<float,_std::allocator<float>_> *local_150;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_148;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_140;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_138;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_130;
  ManagedBuffer<float> *local_128;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_120;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_118;
  ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *local_110;
  ManagedBuffer<unsigned_int> *local_108;
  ManagedBuffer<unsigned_int> *local_100;
  ManagedBuffer<unsigned_int> *local_f8;
  undefined1 *local_f0;
  undefined **local_e8;
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *local_e0;
  _Any_data local_d8;
  code *pcStack_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *pcStack_a8;
  code *pcStack_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  undefined1 auVar13 [56];
  
  WeakReferrable::WeakReferrable((WeakReferrable *)&this->field_0xed0);
  (this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure._vptr_Structure =
       (_func_int **)0x5f9568;
  *(undefined8 *)&this->field_0xed0 = 0x5f9608;
  pcVar4 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + name->_M_string_length);
  (*(this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure._vptr_Structure[0xd])
            (&local_50,this);
  QuantityStructure<polyscope::VolumeMesh>::QuantityStructure
            (&this->super_QuantityStructure<polyscope::VolumeMesh>,
             &PTR_construction_vtable_24__005f9620,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  (this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure._vptr_Structure =
       (_func_int **)0x5f9568;
  *(undefined8 *)&this->field_0xed0 = 0x5f9608;
  local_e8 = &PTR_construction_vtable_24__005f9620;
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  local_e0 = vertexPositions_;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  this_00 = &(this->super_QuantityStructure<polyscope::VolumeMesh>).field_0x428;
  registry_ = &(this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.
               super_ManagedBufferRegistry;
  paVar1 = &local_1c0.field_2;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_178 = &this->vertexPositionsData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            ((ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)this_00,registry_,&local_1c0,
             local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  paVar2 = &local_1a0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_f0 = this_00;
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_180 = &this->triangleVertexIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer
            (&this->triangleVertexInds,registry_,&local_1c0,local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_f8 = &this->triangleVertexInds;
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_100 = &this->triangleFaceInds;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_120 = &this->triangleFaceIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(local_100,registry_,&local_1c0,local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_108 = &this->triangleCellInds;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_130 = &this->triangleCellIndsData;
  render::ManagedBuffer<unsigned_int>::ManagedBuffer(local_108,registry_,&local_1c0,local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_110 = &this->baryCoord;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_138 = &this->baryCoordData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_110,registry_,&local_1c0,local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_118 = &this->edgeIsReal;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_140 = &this->edgeIsRealData;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_118,registry_,&local_1c0,local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  local_128 = &this->faceType;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_150 = &this->faceTypeData;
  render::ManagedBuffer<float>::ManagedBuffer(local_128,registry_,&local_1c0,local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  pcStack_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_b8._M_unused._M_object = operator_new(0x18);
  local_148 = &this->faceNormals;
  local_158 = &this->faceNormalsData;
  *(code **)local_b8._M_unused._0_8_ = computeFaceNormals;
  *(undefined8 *)((long)local_b8._M_unused._0_8_ + 8) = 0;
  *(VolumeMesh **)((long)local_b8._M_unused._0_8_ + 0x10) = this;
  pcStack_a0 = std::
               _Function_handler<void_(),_std::_Bind<void_(polyscope::VolumeMesh::*(polyscope::VolumeMesh_*))()>_>
               ::_M_invoke;
  pcStack_a8 = std::
               _Function_handler<void_(),_std::_Bind<void_(polyscope::VolumeMesh::*(polyscope::VolumeMesh_*))()>_>
               ::_M_manager;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_148,registry_,&local_1c0,local_158,(function<void_()> *)&local_b8);
  if (pcStack_a8 != (code *)0x0) {
    (*pcStack_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  pcStack_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x18);
  local_160 = &this->cellCenters;
  local_168 = &this->cellCentersData;
  *(code **)local_d8._M_unused._0_8_ = computeCellCenters;
  *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0;
  *(VolumeMesh **)((long)local_d8._M_unused._0_8_ + 0x10) = this;
  pcStack_c0 = std::
               _Function_handler<void_(),_std::_Bind<void_(polyscope::VolumeMesh::*(polyscope::VolumeMesh_*))()>_>
               ::_M_invoke;
  pcStack_c8 = std::
               _Function_handler<void_(),_std::_Bind<void_(polyscope::VolumeMesh::*(polyscope::VolumeMesh_*))()>_>
               ::_M_manager;
  render::ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_>::ManagedBuffer
            (local_160,registry_,&local_1c0,local_168,(function<void_()> *)&local_d8);
  if (pcStack_c8 != (code *)0x0) {
    (*pcStack_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  std::vector<std::array<unsigned_int,_8UL>,_std::allocator<std::array<unsigned_int,_8UL>_>_>::
  vector(&this->cells,cellIndices_);
  (this->faceIsInterior).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->faceIsInterior).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->faceIsInterior).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tets).
  super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tets).
  super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tets).
  super__Vector_base<std::array<unsigned_int,_4UL>,_std::allocator<std::array<unsigned_int,_4UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->volumeSlicePlaneListeners).
  super__Vector_base<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->volumeSlicePlaneListeners).
  super__Vector_base<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->volumeSlicePlaneListeners).
  super__Vector_base<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170 = &this->cells;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(local_178,local_e0);
  (((vector<float,_std::allocator<float>_> *)(local_180 + 5))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (((vector<float,_std::allocator<float>_> *)(local_180 + 5))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 6))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 6))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 6))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 7))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 7))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 7))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 3))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 3))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 3))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 4))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 4))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
     *)(local_180 + 4))->
  super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((vector<float,_std::allocator<float>_> *)(local_180 + 5))->
  super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (local_180->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_180->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_180->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_180[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_180[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_180[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_180[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  vVar15 = getNextUniqueColor();
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->color,&local_1c0,vVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->interiorColor,&local_1c0,(this->color).value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::PersistentValue
            (&this->edgeColor,&local_1c0,(vec<3,_float,_(glm::qualifier)0>)ZEXT812(0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"clay","");
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::PersistentValue(&this->material,&local_1c0,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  Structure::uniquePrefix_abi_cxx11_(&local_1a0,(Structure *)this);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1a0);
  psVar10 = (size_type *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0.field_2._8_8_ = plVar7[3];
    local_1c0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c0.field_2._M_allocated_capacity = *psVar10;
    local_1c0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_1c0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  PersistentValue<float>::PersistentValue(&this->edgeWidth,&local_1c0,0.0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  this->activeLevelSetQuantity = (VolumeMeshVertexScalarQuantity *)0x0;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->program).super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pickProgram).
  super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->nFacesTriangulationCount = 0;
  this->nFacesCount = 0;
  if ((this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.cullWholeElements.
      holdsDefaultValue == true) {
    (this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.cullWholeElements.value =
         true;
    pmVar8 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&detail::persistentCache_bool,
                          &(this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure.
                           cullWholeElements.name);
    *pmVar8 = true;
  }
  vVar15.field_0 = (this->color).value.field_0;
  vVar15.field_1 = (this->color).value.field_1;
  vVar15.field_2 = (this->color).value.field_2;
  auVar13 = ZEXT856(0);
  vVar15 = RGBtoHSV(vVar15);
  hsv.field_2 = vVar15.field_2;
  auVar11._0_8_ = vVar15._0_8_;
  auVar11._8_56_ = auVar13;
  auVar14 = vmovshdup_avx(auVar11._0_16_);
  dVar5 = (double)auVar14._0_4_ * 0.3;
  auVar14._0_4_ = (float)dVar5;
  auVar14._4_4_ = (int)((ulong)dVar5 >> 0x20);
  auVar14._8_8_ = 0;
  auVar14 = vinsertps_avx(auVar11._0_16_,auVar14,0x10);
  hsv._0_8_ = auVar14._0_8_;
  auVar13 = ZEXT856(auVar14._8_8_);
  vVar15 = HSVtoRGB(hsv);
  auVar12._0_8_ = vVar15._0_8_;
  auVar12._8_56_ = auVar13;
  if ((this->interiorColor).holdsDefaultValue == true) {
    uVar3 = vmovlps_avx(auVar12._0_16_);
    (this->interiorColor).value.field_0 =
         (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar3;
    (this->interiorColor).value.field_1 =
         (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(int)((ulong)uVar3 >> 0x20)
    ;
    (this->interiorColor).value.field_2 = vVar15.field_2;
    pmVar9 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::vec<3,_float,_(glm::qualifier)0>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&detail::persistentCache_glmvec3,&(this->interiorColor).name);
    pmVar9->field_2 = (this->interiorColor).value.field_2;
    aVar6 = (this->interiorColor).value.field_1;
    pmVar9->field_0 = (this->interiorColor).value.field_0;
    pmVar9->field_1 = aVar6;
  }
  computeCounts(this);
  computeConnectivityData(this);
  (*(this->super_QuantityStructure<polyscope::VolumeMesh>).super_Structure._vptr_Structure[0x10])
            (this);
  return;
}

Assistant:

VolumeMesh::VolumeMesh(std::string name, const std::vector<glm::vec3>& vertexPositions_,
                       const std::vector<std::array<uint32_t, 8>>& cellIndices_)
    : QuantityStructure<VolumeMesh>(name, typeName()),
      // clang-format off

// == managed quantities

// positions
vertexPositions(        this, uniquePrefix() + "vertexPositions",     vertexPositionsData),

// connectivity / indices
triangleVertexInds(     this, uniquePrefix() + "triangleVertexInds",  triangleVertexIndsData),
triangleFaceInds(       this, uniquePrefix() + "triangleFaceInds",    triangleFaceIndsData),
triangleCellInds(       this, uniquePrefix() + "triangleCellInds",    triangleCellIndsData),

// internal triangle data for rendering
baryCoord(              this, uniquePrefix() + "baryCoord",           baryCoordData),
edgeIsReal(             this, uniquePrefix() + "edgeIsReal",          edgeIsRealData),
faceType(               this, uniquePrefix() + "faceType",            faceTypeData),

// other internally-computed geometry
faceNormals(            this, uniquePrefix() + "faceNormals",         faceNormalsData,        std::bind(&VolumeMesh::computeFaceNormals, this)),
cellCenters(            this, uniquePrefix() + "cellCenters",         cellCentersData,        std::bind(&VolumeMesh::computeCellCenters, this)),         


// == core input data
cells(cellIndices_),
vertexPositionsData(vertexPositions_), 

// == persistent options
color(uniquePrefix() + "color", getNextUniqueColor()),
interiorColor(uniquePrefix() + "interiorColor", color.get()),
edgeColor(uniquePrefix() + "edgeColor", glm::vec3{0., 0., 0.}), 
material(uniquePrefix() + "material", "clay"),
edgeWidth(uniquePrefix() + "edgeWidth", 0.), 

// == misc values
activeLevelSetQuantity(nullptr) 
{
  // clang-format on

  cullWholeElements.setPassive(true);

  // set the interior color to be a desaturated version of the normal one
  glm::vec3 desatColorHSV = RGBtoHSV(color.get());
  desatColorHSV.y *= 0.3;
  interiorColor.setPassive(HSVtoRGB(desatColorHSV));

  computeCounts();
  computeConnectivityData();
  updateObjectSpaceBounds();
}